

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void Fl::focus(Fl_Widget *o)

{
  uint uVar1;
  int iVar2;
  Fl_Window *pFVar3;
  undefined4 extraout_var;
  Fl_X *pFVar4;
  int old_event;
  Fl_X *x;
  Fl_Window *w1;
  Fl_Window *win;
  Fl_Widget *p;
  Fl_Widget *o_local;
  
  if ((((o == (Fl_Widget *)0x0) ||
       (uVar1 = Fl_Widget::visible_focus(o), iVar2 = e_number, uVar1 != 0)) &&
      (pFVar3 = grab(), iVar2 = e_number, pFVar3 == (Fl_Window *)0x0)) &&
     (win = (Fl_Window *)focus_, o != focus_)) {
    compose_reset();
    focus_ = o;
    if (o != (Fl_Widget *)0x0) {
      w1 = (Fl_Window *)0x0;
      iVar2 = (*o->_vptr_Fl_Widget[8])();
      x = (Fl_X *)CONCAT44(extraout_var,iVar2);
      if (x == (Fl_X *)0x0) {
        x = (Fl_X *)Fl_Widget::window(o);
      }
      for (; x != (Fl_X *)0x0; x = (Fl_X *)Fl_Widget::window((Fl_Widget *)x)) {
        w1 = (Fl_Window *)x;
      }
      if (w1 != (Fl_Window *)0x0) {
        if (fl_xfocus != w1) {
          pFVar4 = Fl_X::i(w1);
          iVar2 = Fl_X::ewmh_supported();
          if (iVar2 == 0) {
            (*(w1->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
          }
          else if (pFVar4 != (Fl_X *)0x0) {
            Fl_X::activate_window(pFVar4->xid);
          }
        }
        fl_xfocus = w1;
      }
    }
    iVar2 = e_number;
    fl_oldfocus = (Fl_Widget *)0x0;
    e_number = 7;
    for (; win != (Fl_Window *)0x0; win = (Fl_Window *)Fl_Widget::parent((Fl_Widget *)win)) {
      (*(win->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(win,7);
      fl_oldfocus = (Fl_Widget *)win;
    }
  }
  e_number = iVar2;
  return;
}

Assistant:

void Fl::focus(Fl_Widget *o) {
  if (o && !o->visible_focus()) return;
  if (grab()) return; // don't do anything while grab is on
  Fl_Widget *p = focus_;
  if (o != p) {
    Fl::compose_reset();
    focus_ = o;
    // make sure that fl_xfocus is set to the top level window
    // of this widget, or fl_fix_focus will clear our focus again
    if (o) {
      Fl_Window *win = 0, *w1 = o->as_window();
      if (!w1) w1 = o->window();
      while (w1) { win=w1; w1=win->window(); }
      if (win) {
#ifdef __APPLE__
	if (fl_xfocus != win) {
	  Fl_X *x = Fl_X::i(win);
	  if (x) x->set_key_window();
	}
#elif defined(USE_X11)
	if (fl_xfocus != win) {
	  Fl_X *x = Fl_X::i(win);
	  if (!Fl_X::ewmh_supported())
	    win->show(); // Old WMs, XMapRaised
	  else if (x) // New WMs use the NETWM attribute:
	    Fl_X::activate_window(x->xid);
	}
#endif
	fl_xfocus = win;
      }
    }
    // take focus from the old focused window
    fl_oldfocus = 0;
    int old_event = e_number;
    e_number = FL_UNFOCUS;
    for (; p; p = p->parent()) {
      p->handle(FL_UNFOCUS);
      fl_oldfocus = p;
    }
    e_number = old_event;
  }
}